

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_rehash.cpp
# Opt level: O0

void __thiscall
RehashReplayer::set_application_info
          (RehashReplayer *this,Hash hash,VkApplicationInfo *info,
          VkPhysicalDeviceFeatures2 *features)

{
  bool bVar1;
  VkPhysicalDeviceFeatures2 *features_local;
  VkApplicationInfo *info_local;
  Hash hash_local;
  RehashReplayer *this_local;
  
  if (((this->should_filter_application_hash & 1U) == 0) &&
     ((this->has_set_application_info & 1U) != 0)) {
    fprintf(_stderr,
            "Fossilize ERROR: There are multiple VkApplicationInfo in this database. All blobs in this input database will be assigned to the first application info.\n"
           );
  }
  else if (((this->has_set_application_info & 1U) == 0) &&
          (((this->should_filter_application_hash & 1U) == 0 ||
           (hash == this->filter_application_hash)))) {
    if ((info != (VkApplicationInfo *)0x0) &&
       (bVar1 = Fossilize::StateRecorder::record_application_info(this->recorder,info), !bVar1)) {
      fprintf(_stderr,"Fossilize ERROR: Failed to record application info.\n");
    }
    if ((features != (VkPhysicalDeviceFeatures2 *)0x0) &&
       (bVar1 = Fossilize::StateRecorder::record_physical_device_features(this->recorder,features),
       !bVar1)) {
      fprintf(_stderr,"Fossilize ERROR: Failed to record physical device features.\n");
    }
    this->has_set_application_info = true;
  }
  return;
}

Assistant:

void set_application_info(Hash hash, const VkApplicationInfo *info, const VkPhysicalDeviceFeatures2 *features) override
	{
		if (!should_filter_application_hash && has_set_application_info)
		{
			LOGE("There are multiple VkApplicationInfo in this database. All blobs in this input database will be assigned to the first application info.\n");
		}
		else if (!has_set_application_info && (!should_filter_application_hash || hash == filter_application_hash))
		{
			if (info)
				if (!recorder->record_application_info(*info))
					LOGE("Failed to record application info.\n");
			if (features)
				if (!recorder->record_physical_device_features(features))
					LOGE("Failed to record physical device features.\n");
			has_set_application_info = true;
		}
	}